

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdg.c
# Opt level: O1

char * xdg_get_path(char *xdg_env,char *default_path)

{
  __uid_t __uid;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  passwd *ppVar4;
  char *pcVar5;
  void *__dest;
  size_t size;
  
  if (((xdg_env == (char *)0x0) || (default_path == (char *)0x0)) || (*default_path == '/')) {
    __assert_fail("xdg_env && default_path && default_path[0] != \'/\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/xdg/xdg.c",
                  0x35,"char *xdg_get_path(const char *, const char *)");
  }
  pcVar2 = getenv(xdg_env);
  if ((pcVar2 != (char *)0x0) && (*pcVar2 == '/')) {
    sVar3 = strlen(pcVar2);
    if (sVar3 + 1 == 0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = (char *)calloc(1,sVar3 + 1);
    }
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      memcpy(pcVar5,pcVar2,sVar3);
    }
    if (pcVar5 == (char *)0x0) {
      return (char *)0x0;
    }
    sVar3 = strlen(pcVar5);
    if (sVar3 == 0) {
      return (char *)0x0;
    }
    pcVar2 = pcVar5 + sVar3;
    while( true ) {
      pcVar2 = pcVar2 + -1;
      if (pcVar2 < pcVar5) {
        return pcVar5;
      }
      if (*pcVar2 != '/') break;
      *pcVar2 = '\0';
    }
    return pcVar5;
  }
  pcVar2 = getenv("HOME");
  if ((pcVar2 == (char *)0x0) || (*pcVar2 != '/')) {
    __uid = getuid();
    ppVar4 = getpwuid(__uid);
    if ((ppVar4 != (passwd *)0x0) &&
       ((pcVar2 = ppVar4->pw_dir, pcVar2 != (char *)0x0 && (*pcVar2 == '/')))) goto LAB_00101226;
  }
  else {
LAB_00101226:
    sVar3 = strlen(pcVar2);
    if (sVar3 + 1 == 0) {
      __dest = (void *)0x0;
    }
    else {
      __dest = calloc(1,sVar3 + 1);
    }
    if (__dest != (void *)0x0) {
      memcpy(__dest,pcVar2,sVar3);
      goto LAB_0010128c;
    }
  }
  __dest = (void *)0x0;
LAB_0010128c:
  if (__dest == (void *)0x0) {
    return (char *)0x0;
  }
  iVar1 = snprintf((char *)0x0,0,"%s/%s",__dest,default_path);
  pcVar5 = (char *)calloc(1,(long)(iVar1 + 1));
  pcVar2 = (char *)0x0;
  if (pcVar5 != (char *)0x0) {
    snprintf(pcVar5,(long)(iVar1 + 1),"%s/%s",__dest,default_path);
    pcVar2 = pcVar5;
  }
  free(__dest);
  return pcVar2;
}

Assistant:

char*
xdg_get_path(const char *xdg_env, const char *default_path)
{
   assert(xdg_env && default_path && default_path[0] != '/');

   if (!xdg_env || !default_path || default_path[0] == '/')
      return NULL;

   const char *xdg_dir;
   if ((xdg_dir = getenv(xdg_env)) && xdg_dir[0] == '/')
      return strip_slash(ccopy(xdg_dir));

   char *home;
   if (!(home = get_home()))
      return NULL; /** fatal! */

   const size_t len = snprintf(NULL, 0, "%s/%s", home, default_path) + 1;

   char *path;
   if (!(path = calloc(1, len))) {
      free(home);
      return NULL; /** fatal! */
   }

   snprintf(path, len, "%s/%s", home, default_path);
   free(home);
   return path;
}